

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4f *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_30 [8];
  float4 v;
  color4f *value_local;
  AsciiParser *this_local;
  
  v._M_elems._8_8_ = value;
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_30);
  if (bVar1) {
    pvVar2 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,0);
    *(value_type_conflict6 *)v._M_elems._8_8_ = *pvVar2;
    pvVar2 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,1);
    *(value_type_conflict6 *)(v._M_elems._8_8_ + 4) = *pvVar2;
    pvVar2 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,2);
    *(value_type_conflict6 *)(v._M_elems._8_8_ + 8) = *pvVar2;
    pvVar2 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,3);
    *(value_type_conflict6 *)(v._M_elems._8_8_ + 0xc) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4f *value) {
  value::float4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    value->a = v[3];
    return true;
  }
  return false;
}